

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

char * str_skipnextword(char *src)

{
  ushort **ppuVar1;
  bool bVar2;
  char *local_18;
  char *src_local;
  
  local_18 = src;
  if (src == (char *)0x0) {
    src_local = (char *)0x0;
  }
  else {
    while (ppuVar1 = __ctype_b_loc(), ((*ppuVar1)[(int)*local_18] & 1) != 0) {
      local_18 = local_18 + 1;
    }
    while( true ) {
      bVar2 = false;
      if (*local_18 != '\0') {
        ppuVar1 = __ctype_b_loc();
        bVar2 = ((*ppuVar1)[(int)*local_18] & 1) == 0;
      }
      if (!bVar2) break;
      local_18 = local_18 + 1;
    }
    while (ppuVar1 = __ctype_b_loc(), ((*ppuVar1)[(int)*local_18] & 1) != 0) {
      local_18 = local_18 + 1;
    }
    if (*local_18 == '\0') {
      src_local = (char *)0x0;
    }
    else {
      src_local = local_18;
    }
  }
  return src_local;
}

Assistant:

const char *
str_skipnextword(const char *src) {
  /* sanity check */
  if (src == NULL) {
    return NULL;
  }

  /* skip whitespace prefix */
  while (isblank(*src)) {
    src++;
  }

  /* copy next word */
  while (*src != 0 && !isblank(*src)) {
    src++;
  }

  /* skip ahead in src */
  while (isblank(*src)) {
    src++;
  }

  if (*src) {
    /* return next word */
    return src;
  }

  /* end of src */
  return NULL;
}